

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O2

int ssl_parse_client_psk_identity(mbedtls_ssl_context *ssl,uchar **p,uchar *end)

{
  mbedtls_ssl_config *pmVar1;
  ushort uVar2;
  int iVar3;
  ulong n;
  ushort *buf;
  
  pmVar1 = ssl->conf;
  if ((pmVar1->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) &&
     ((((pmVar1->psk == (uchar *)0x0 || (pmVar1->psk_identity == (uchar *)0x0)) ||
       (pmVar1->psk_identity_len == 0)) || (pmVar1->psk_len == 0)))) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0xc93,"got no pre-shared key");
    return -0x7600;
  }
  buf = (ushort *)((long)*p + 2);
  if (end < buf) {
    iVar3 = 0xc9c;
LAB_0012091c:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,iVar3,"bad client key exchange message");
    return -0x7c00;
  }
  uVar2 = *(ushort *)*p;
  uVar2 = uVar2 << 8 | uVar2 >> 8;
  n = (ulong)uVar2;
  *p = (uchar *)buf;
  if (end < (uchar *)((long)buf + n) || uVar2 == 0) {
    iVar3 = 0xca5;
    goto LAB_0012091c;
  }
  pmVar1 = ssl->conf;
  if (pmVar1->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) {
    if (n != pmVar1->psk_identity_len) goto LAB_00120976;
    iVar3 = mbedtls_ssl_safer_memcmp(pmVar1->psk_identity,buf,n);
  }
  else {
    iVar3 = (*pmVar1->f_psk)(pmVar1->p_psk,ssl,(uchar *)buf,n);
    buf = (ushort *)*p;
  }
  if (iVar3 == 0) {
    *p = (uchar *)((long)buf + n);
    return 0;
  }
LAB_00120976:
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,0xcbb,"Unknown PSK identity",(uchar *)buf,n);
  iVar3 = mbedtls_ssl_send_alert_message(ssl,'\x02','s');
  if (iVar3 == 0) {
    return -0x6c80;
  }
  return iVar3;
}

Assistant:

static int ssl_parse_client_psk_identity( mbedtls_ssl_context *ssl, unsigned char **p,
                                          const unsigned char *end )
{
    int ret = 0;
    size_t n;

    if( ssl->conf->f_psk == NULL &&
        ( ssl->conf->psk == NULL || ssl->conf->psk_identity == NULL ||
          ssl->conf->psk_identity_len == 0 || ssl->conf->psk_len == 0 ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no pre-shared key" ) );
        return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
    }

    /*
     * Receive client pre-shared key identity name
     */
    if( *p + 2 > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    n = ( (*p)[0] << 8 ) | (*p)[1];
    *p += 2;

    if( n < 1 || n > 65535 || *p + n > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    if( ssl->conf->f_psk != NULL )
    {
        if( ssl->conf->f_psk( ssl->conf->p_psk, ssl, *p, n ) != 0 )
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
    }
    else
    {
        /* Identity is not a big secret since clients send it in the clear,
         * but treat it carefully anyway, just in case */
        if( n != ssl->conf->psk_identity_len ||
            mbedtls_ssl_safer_memcmp( ssl->conf->psk_identity, *p, n ) != 0 )
        {
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
        }
    }

    if( ret == MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY )
    {
        MBEDTLS_SSL_DEBUG_BUF( 3, "Unknown PSK identity", *p, n );
        if( ( ret = mbedtls_ssl_send_alert_message( ssl,
                              MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                              MBEDTLS_SSL_ALERT_MSG_UNKNOWN_PSK_IDENTITY ) ) != 0 )
        {
            return( ret );
        }

        return( MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY );
    }

    *p += n;

    return( 0 );
}